

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpecParser::TestSpecParser(TestSpecParser *this,ITagAliasRegistry *tagAliases)

{
  TestSpec *in_RSI;
  undefined4 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x10));
  std::__cxx11::string::string((string *)(in_RDI + 0x18));
  clara::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x137a2b);
  TestSpec::Filter::Filter((Filter *)0x137a3b);
  TestSpec::TestSpec(in_RSI);
  *(TestSpec **)(in_RDI + 0x38) = in_RSI;
  return;
}

Assistant:

TestSpecParser::TestSpecParser( ITagAliasRegistry const& tagAliases ) : m_tagAliases( &tagAliases ) {}